

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O0

bool __thiscall SQClass::GetAttributes(SQClass *this,SQObjectPtr *key,SQObjectPtr *outval)

{
  bool bVar1;
  SQClassMember *pSVar2;
  SQObjectPtr *local_70;
  undefined1 local_38 [8];
  SQObjectPtr idx;
  SQObjectPtr *outval_local;
  SQObjectPtr *key_local;
  SQClass *this_local;
  
  idx.super_SQObject._unVal = (SQObjectValue)outval;
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_38);
  bVar1 = SQTable::Get(this->_members,key,(SQObjectPtr *)local_38);
  if (bVar1) {
    if ((idx.super_SQObject._0_8_ & 0x2000000) == 0) {
      pSVar2 = sqvector<SQClassMember>::operator[]
                         (&this->_methods,(ulong)(idx.super_SQObject._type & 0xffffff));
    }
    else {
      pSVar2 = sqvector<SQClassMember>::operator[]
                         (&this->_defaultvalues,(ulong)(idx.super_SQObject._type & 0xffffff));
    }
    local_70 = &pSVar2->attrs;
    ::SQObjectPtr::operator=((SQObjectPtr *)idx.super_SQObject._unVal.pTable,local_70);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_38);
  return this_local._7_1_;
}

Assistant:

bool SQClass::GetAttributes(const SQObjectPtr &key,SQObjectPtr &outval)
{
    SQObjectPtr idx;
    if(_members->Get(key,idx)) {
        outval = (_isfield(idx)?_defaultvalues[_member_idx(idx)].attrs:_methods[_member_idx(idx)].attrs);
        return true;
    }
    return false;
}